

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_183::TNHOracle::infer(TNHOracle *this)

{
  Module *this_00;
  bool bVar1;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *this_01;
  pointer pFVar2;
  mapped_type *this_02;
  HeapType *pHVar3;
  Map *this_03;
  reference __in;
  type *ptVar4;
  reference __in_00;
  type *__k;
  type *other;
  mapped_type *this_04;
  optional<wasm::HeapType> oVar5;
  type *contents;
  type *expr;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::PossibleContents>,_false> local_138;
  iterator __end3_1;
  iterator __begin3_1;
  unordered_map<wasm::Expression_*,_wasm::PossibleContents,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::PossibleContents>_>_>
  *__range3_1;
  type *info_1;
  type *_;
  _Self local_108;
  iterator __end2;
  iterator __begin2;
  Map *__range2;
  unordered_map<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  *local_e8;
  function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::TNHInfo_&)> local_e0;
  _Storage<wasm::HeapType,_true> local_c0;
  optional<wasm::HeapType> super;
  Function *local_80;
  mapped_type *local_78;
  mapped_type *info;
  HeapType type;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range3;
  unordered_map<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  typeFunctions;
  TNHOracle *this_local;
  
  typeFunctions._M_h._M_single_bucket = (__node_base_ptr)this;
  std::
  unordered_map<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  ::unordered_map((unordered_map<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                   *)&__range3);
  if ((this->options->closedWorld & 1U) != 0) {
    this_01 = &((this->
                super_ParallelFunctionAnalysis<wasm::(anonymous_namespace)::TNHInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                ).wasm)->functions;
    __end3 = std::
             vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ::begin(this_01);
    func = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
           std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                       *)&func), bVar1) {
      type.id = (uintptr_t)
                __gnu_cxx::
                __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                ::operator*(&__end3);
      pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                          type.id);
      info = (mapped_type *)(pFVar2->type).id;
      this_00 = (this->
                super_ParallelFunctionAnalysis<wasm::(anonymous_namespace)::TNHInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                ).wasm;
      pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                          type.id);
      local_80 = Module::getFunction(this_00,(Name)(pFVar2->super_Importable).super_Named.name.
                                                   super_IString.str);
      local_78 = std::
                 map<wasm::Function_*,_wasm::(anonymous_namespace)::TNHInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::TNHInfo>_>_>
                 ::operator[](&(this->
                               super_ParallelFunctionAnalysis<wasm::(anonymous_namespace)::TNHInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                               ).map,&local_80);
      if ((local_78->traps & 1U) == 0) {
        while( true ) {
          this_02 = std::
                    unordered_map<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                    ::operator[]((unordered_map<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                                  *)&__range3,(key_type *)&info);
          super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._8_8_ =
               std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                         ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                          type.id);
          std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::push_back
                    (this_02,(value_type *)
                             &super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                              super__Optional_payload_base<wasm::HeapType>._M_engaged);
          oVar5 = HeapType::getDeclaredSuperType((HeapType *)&info);
          local_c0 = oVar5.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::HeapType>._M_payload;
          super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
               oVar5.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_engaged;
          bVar1 = std::optional::operator_cast_to_bool((optional *)&local_c0._M_value);
          if (!bVar1) break;
          pHVar3 = std::optional<wasm::HeapType>::operator*
                             ((optional<wasm::HeapType> *)&local_c0._M_value);
          info = (mapped_type *)pHVar3->id;
        }
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
      ::operator++(&__end3);
    }
  }
  local_e8 = (unordered_map<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
              *)&__range3;
  __range2 = (Map *)this;
  std::function<void(wasm::Function*,wasm::(anonymous_namespace)::TNHInfo&)>::
  function<wasm::(anonymous_namespace)::TNHOracle::infer()::__0,void>
            ((function<void(wasm::Function*,wasm::(anonymous_namespace)::TNHInfo&)> *)&local_e0,
             (anon_class_16_2_12f7416e *)&__range2);
  wasm::ModuleUtils::
  ParallelFunctionAnalysis<wasm::(anonymous_namespace)::TNHInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  ::doAnalysis(&this->
                super_ParallelFunctionAnalysis<wasm::(anonymous_namespace)::TNHInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
               ,(Func *)&local_e0);
  std::function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::TNHInfo_&)>::~function
            (&local_e0);
  this_03 = &(this->
             super_ParallelFunctionAnalysis<wasm::(anonymous_namespace)::TNHInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
             ).map;
  __end2 = std::
           map<wasm::Function_*,_wasm::(anonymous_namespace)::TNHInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::TNHInfo>_>_>
           ::begin(this_03);
  local_108._M_node =
       (_Base_ptr)
       std::
       map<wasm::Function_*,_wasm::(anonymous_namespace)::TNHInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::TNHInfo>_>_>
       ::end(this_03);
  while (bVar1 = std::operator!=(&__end2,&local_108), bVar1) {
    __in = std::
           _Rb_tree_iterator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::TNHInfo>_>
           ::operator*(&__end2);
    std::get<0ul,wasm::Function*const,wasm::(anonymous_namespace)::TNHInfo>(__in);
    ptVar4 = std::get<1ul,wasm::Function*const,wasm::(anonymous_namespace)::TNHInfo>(__in);
    __end3_1 = std::
               unordered_map<wasm::Expression_*,_wasm::PossibleContents,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::PossibleContents>_>_>
               ::begin(&ptVar4->inferences);
    local_138._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Expression_*,_wasm::PossibleContents,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::PossibleContents>_>_>
         ::end(&ptVar4->inferences);
    while (bVar1 = std::__detail::operator!=
                             (&__end3_1.
                               super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::PossibleContents>,_false>
                              ,&local_138), bVar1) {
      __in_00 = std::__detail::
                _Node_iterator<std::pair<wasm::Expression_*const,_wasm::PossibleContents>,_false,_false>
                ::operator*(&__end3_1);
      __k = std::get<0ul,wasm::Expression*const,wasm::PossibleContents>(__in_00);
      other = std::get<1ul,wasm::Expression*const,wasm::PossibleContents>(__in_00);
      this_04 = std::
                unordered_map<wasm::Expression_*,_wasm::PossibleContents,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::PossibleContents>_>_>
                ::operator[](&this->inferences,__k);
      PossibleContents::operator=(this_04,other);
      std::__detail::
      _Node_iterator<std::pair<wasm::Expression_*const,_wasm::PossibleContents>,_false,_false>::
      operator++(&__end3_1);
    }
    std::_Rb_tree_iterator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::TNHInfo>_>
    ::operator++(&__end2);
  }
  std::
  unordered_map<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  ::~unordered_map((unordered_map<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                    *)&__range3);
  return;
}

Assistant:

void TNHOracle::infer() {
  // Phase 2: Inside each function, optimize calls based on the cast params of
  // the called function (which we noted during phase 1).
  //
  // Specifically, each time we call a target that will cast a param, we can
  // infer that the param must have that type (or else we'd trap, but we are
  // assuming traps never happen).
  //
  // While doing so we must be careful of control flow transfers right before
  // the call:
  //
  //  (call $target
  //    (A)
  //    (br_if ..)
  //    (B)
  //  )
  //
  // If we branch in the br_if then we might execute A and then something else
  // entirely, and not reach B or the call. In that case we can't infer anything
  // about A (perhaps, for example, we branch away exactly when A would fail the
  // cast). Therefore in the optimization below we only optimize code that, if
  // reached, will definitely reach the call, like B.
  //
  // TODO: Some control flow transfers are ok, so long as we must reach the
  //       call, like if we replace the br_if with an if with two arms (and no
  //       branches in either).
  // TODO: We can also infer backwards past basic blocks from casts, even
  //       without calls. Any cast tells us something about the uses of that
  //       value that must reach the cast.
  // TODO: We can do a whole-program flow of this information.

  // For call_ref, we need to know which functions belong to each type. Gather
  // that first. This map will map each heap type to each function that is of
  // that type or a subtype, i.e., might be called when that type is seen in a
  // call_ref target.
  std::unordered_map<HeapType, std::vector<Function*>> typeFunctions;
  if (options.closedWorld) {
    for (auto& func : wasm.functions) {
      auto type = func->type;
      auto& info = map[wasm.getFunction(func->name)];
      if (info.traps) {
        // This function definitely traps, so we can assume it is never called,
        // and don't need to even bother putting it in |typeFunctions|.
        continue;
      }
      while (1) {
        typeFunctions[type].push_back(func.get());
        if (auto super = type.getDeclaredSuperType()) {
          type = *super;
        } else {
          break;
        }
      }
    }
  }

  doAnalysis([&](Function* func, TNHInfo& info) {
    // We will need some CFG information below. Computing this is expensive, so
    // only do it if we find optimization opportunities.
    std::optional<analysis::CFGBlockIndexes> blockIndexes;

    auto ensureCFG = [&]() {
      if (!blockIndexes) {
        auto cfg = analysis::CFG::fromFunction(func);
        blockIndexes = analysis::CFGBlockIndexes(cfg);
      }
    };

    for (auto* call : info.calls) {
      auto& targetInfo = map[wasm.getFunction(call->target)];

      auto& targetCastParams = targetInfo.castParams;
      if (targetCastParams.empty()) {
        continue;
      }

      // This looks promising, create the CFG if we haven't already, and
      // optimize.
      ensureCFG();
      optimizeCallCasts(
        call, call->operands, targetCastParams, *blockIndexes, info);

      // Note that we don't need to do anything for targetInfo.traps for a
      // direct call: the inliner will inline the singleton unreachable in the
      // target function anyhow.
    }

    for (auto* call : info.callRefs) {
      auto targetType = call->target->type;
      if (!targetType.isRef()) {
        // This is unreachable or null, and other passes will optimize that.
        continue;
      }

      // We should only get here in a closed world, in which we know which
      // functions might be called (the scan phase only notes callRefs if we are
      // in fact in a closed world).
      assert(options.closedWorld);

      auto iter = typeFunctions.find(targetType.getHeapType());
      if (iter == typeFunctions.end()) {
        // No function exists of this type, so the call_ref will trap. We can
        // mark the target as empty, which has the identical effect.
        info.inferences[call->target] = PossibleContents::none();
        continue;
      }

      // Go through the targets and ignore any that will trap. That will leave
      // us with the actually possible targets.
      //
      // Note that we did not even add functions that certainly trap to
      // |typeFunctions| at all, so those are already excluded.
      const auto& targets = iter->second;
      std::vector<Function*> possibleTargets;
      for (Function* target : targets) {
        auto& targetInfo = map[target];

        // If any of our operands will fail a cast, then we will trap.
        bool traps = false;
        for (auto& [castIndex, castType] : targetInfo.castParams) {
          auto operandType = call->operands[castIndex]->type;
          auto result = GCTypeUtils::evaluateCastCheck(operandType, castType);
          if (result == GCTypeUtils::Failure) {
            traps = true;
            break;
          }
        }
        if (!traps) {
          possibleTargets.push_back(target);
        }
      }

      if (possibleTargets.empty()) {
        // No target is possible.
        info.inferences[call->target] = PossibleContents::none();
        continue;
      }

      if (possibleTargets.size() == 1) {
        // There is exactly one possible call target, which means we can
        // actually infer what the call_ref is calling. Add that as an
        // inference.
        // TODO: We could also optimizeCallCasts() here, but it is low priority
        //       as other opts will make this call direct later, after which a
        //       lot of other optimizations become possible anyhow.
        auto target = possibleTargets[0]->name;
        info.inferences[call->target] = PossibleContents::literal(
          Literal(target, wasm.getFunction(target)->type));
        continue;
      }

      // More than one target exists: apply the intersection of their
      // constraints. That is, if they all cast the k-th parameter to type T (or
      // more) than we can apply that here.
      auto numParams = call->operands.size();
      std::vector<Type> sharedCastParamsVec(numParams, Type::unreachable);
      for (auto* target : possibleTargets) {
        auto& targetInfo = map[target];
        auto& targetCastParams = targetInfo.castParams;
        for (Index i = 0; i < numParams; i++) {
          auto iter = targetCastParams.find(i);
          if (iter == targetCastParams.end()) {
            // If the target does not cast, we cannot do anything with this
            // parameter; mark it as unoptimizable with an impossible type.
            sharedCastParamsVec[i] = Type::none;
            continue;
          }

          // This function casts this param. Combine this with existing info.
          auto castType = iter->second;
          sharedCastParamsVec[i] =
            Type::getLeastUpperBound(sharedCastParamsVec[i], castType);
        }
      }

      // Build a map of the interesting cast params we found, and if there are
      // any, optimize using them.
      CastParams sharedCastParams;
      for (Index i = 0; i < numParams; i++) {
        auto type = sharedCastParamsVec[i];
        if (type != Type::none) {
          sharedCastParams[i] = type;
        }
      }
      if (!sharedCastParams.empty()) {
        ensureCFG();
        optimizeCallCasts(
          call, call->operands, sharedCastParams, *blockIndexes, info);
      }
    }
  });

  // Combine all of our inferences from the parallel phase above us into the
  // final list of inferences.
  for (auto& [_, info] : map) {
    for (auto& [expr, contents] : info.inferences) {
      inferences[expr] = contents;
    }
  }
}